

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O0

QpVector * __thiscall Basis::Zprod(Basis *this,QpVector *rhs,QpVector *target)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  const_reference pvVar4;
  reference pvVar5;
  const_reference pvVar6;
  reference pvVar7;
  QpVector *pQVar8;
  long in_RDX;
  int *in_RSI;
  QpVector *in_RDI;
  HighsInt idx;
  HighsInt nonactive;
  HighsInt nz;
  HighsInt i;
  HighsInt in_stack_00000098;
  bool in_stack_0000009f;
  QpVector *in_stack_000000a0;
  QpVector *in_stack_000000a8;
  Basis *in_stack_000000b0;
  int local_1c;
  
  QpVector::reset(in_RDI);
  *(undefined4 *)
   ((long)&in_RDI[4].index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = *(undefined4 *)(in_RDX + 4);
  for (local_1c = 0; local_1c < *in_RSI; local_1c = local_1c + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)local_1c);
    iVar2 = *pvVar4;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[0x29].index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)iVar2);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI[0x2b].index,(long)*pvVar5);
    iVar3 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[4].index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(long)local_1c);
    *pvVar5 = iVar3;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 8),(long)iVar2);
    vVar1 = *pvVar6;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[4].value.super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_finish,(long)iVar3);
    *pvVar7 = vVar1;
  }
  *(int *)&in_RDI[4].index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start = *in_RSI;
  pQVar8 = btran(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_0000009f,
                 in_stack_00000098);
  return pQVar8;
}

Assistant:

QpVector& Basis::Zprod(const QpVector& rhs, QpVector& target) {
  buffer_Zprod.reset();
  buffer_Zprod.dim = target.dim;
  for (HighsInt i = 0; i < rhs.num_nz; i++) {
    HighsInt nz = rhs.index[i];
    HighsInt nonactive = non_active_constraint_index[nz];
    HighsInt idx = constraintindexinbasisfactor[nonactive];
    buffer_Zprod.index[i] = idx;
    buffer_Zprod.value[idx] = rhs.value[nz];
  }
  buffer_Zprod.num_nz = rhs.num_nz;
  return btran(buffer_Zprod, target);
}